

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O2

char * __thiscall
glcts::TextureCubeMapArrayTextureSizeRTFragmentShader::getVertexShaderCode
          (TextureCubeMapArrayTextureSizeRTFragmentShader *this)

{
  return 
  "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n    gl_PointSize = 1.0f;\n    gl_Position = vec4(0, 0, 0, 1.0f);\n}\n"
  ;
}

Assistant:

const char* TextureCubeMapArrayTextureSizeRTFragmentShader::getVertexShaderCode(void)
{
	static const char* result = "${VERSION}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    gl_PointSize = 1.0f;\n"
								"    gl_Position = vec4(0, 0, 0, 1.0f);\n"
								"}\n";

	return result;
}